

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O0

mat4_t * mat4_ortho2(mat4_t *__return_storage_ptr__,vec2_t lb,vec2_t rt)

{
  vec3_t lbn;
  vec3_t rtf;
  vec3_t vr;
  vec3_t vl;
  undefined4 uStack_14;
  vec2_t rt_local;
  vec2_t lb_local;
  
  rt_local.x = lb.x;
  rt_local.y = lb.y;
  lbn = vec3(rt_local.x,rt_local.y,-1.0);
  vl.z = rt.x;
  uStack_14 = rt.y;
  rtf = vec3(vl.z,uStack_14,1.0);
  mat4_ortho3(__return_storage_ptr__,lbn,rtf);
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_ortho2(vec2_t lb, vec2_t rt) {
    vec3_t	vl	= vec3(lb.x, lb.y, -1.0f);
    vec3_t	vr	= vec3(rt.x, rt.y,  1.0f);
    return mat4_ortho3(vl, vr);
}